

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_NoiseTimer(opm_t *chip)

{
  uint local_14;
  uint32_t timer;
  opm_t *chip_local;
  
  local_14 = chip->noise_timer;
  chip->noise_update = chip->noise_timer_of;
  if ((chip->cycles & 0xf) == 0xf) {
    local_14 = local_14 + 1 & 0x1f;
  }
  if ((chip->ic != '\0') || ((chip->noise_timer_of != '\0' && ((chip->cycles & 0xf) == 0xf)))) {
    local_14 = 0;
  }
  chip->noise_timer_of = chip->noise_timer == (chip->noise_freq ^ 0x1f);
  chip->noise_timer = local_14;
  return;
}

Assistant:

static void OPM_NoiseTimer(opm_t *chip)
{
    uint32_t timer = chip->noise_timer;

    chip->noise_update = chip->noise_timer_of;

    if (chip->cycles % 16 == 15)
    {
        timer++;
        timer &= 31;
    }
    if (chip->ic || (chip->noise_timer_of && (chip->cycles % 16 == 15)))
    {
        timer = 0;
    }

    chip->noise_timer_of = chip->noise_timer == (chip->noise_freq ^ 31);
    chip->noise_timer = timer;
}